

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::InitialPass
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  string subCommand;
  string e;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    std::__cxx11::string::string
              ((string *)&local_60,"must be called with at least two arguments.",
               (allocator *)&local_40);
    cmCommand::SetError(&this->super_cmCommand,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    bVar2 = false;
  }
  else {
    std::__cxx11::string::string((string *)&local_60,(string *)pbVar1);
    bVar2 = std::operator==(&local_60,"WRITE");
    if ((bVar2) || (bVar3 = std::operator==(&local_60,"APPEND"), bVar3)) {
      bVar2 = HandleWriteCommand(this,args,!bVar2);
    }
    else {
      bVar2 = std::operator==(&local_60,"DOWNLOAD");
      if (bVar2) {
        bVar2 = HandleDownloadCommand(this,args);
      }
      else {
        bVar2 = std::operator==(&local_60,"UPLOAD");
        if (bVar2) {
          bVar2 = HandleUploadCommand(this,args);
        }
        else {
          bVar2 = std::operator==(&local_60,"READ");
          if (bVar2) {
            bVar2 = HandleReadCommand(this,args);
          }
          else {
            bVar2 = std::operator==(&local_60,"MD5");
            if (((((bVar2) || (bVar2 = std::operator==(&local_60,"SHA1"), bVar2)) ||
                 (bVar2 = std::operator==(&local_60,"SHA224"), bVar2)) ||
                ((bVar2 = std::operator==(&local_60,"SHA256"), bVar2 ||
                 (bVar2 = std::operator==(&local_60,"SHA384"), bVar2)))) ||
               (bVar2 = std::operator==(&local_60,"SHA512"), bVar2)) {
              bVar2 = HandleHashCommand(this,args);
            }
            else {
              bVar2 = std::operator==(&local_60,"STRINGS");
              if (bVar2) {
                bVar2 = HandleStringsCommand(this,args);
              }
              else {
                bVar2 = std::operator==(&local_60,"GLOB");
                if ((bVar2) || (bVar3 = std::operator==(&local_60,"GLOB_RECURSE"), bVar3)) {
                  bVar2 = HandleGlobCommand(this,args,!bVar2);
                }
                else {
                  bVar2 = std::operator==(&local_60,"MAKE_DIRECTORY");
                  if (bVar2) {
                    bVar2 = HandleMakeDirectoryCommand(this,args);
                  }
                  else {
                    bVar2 = std::operator==(&local_60,"RENAME");
                    if (bVar2) {
                      bVar2 = HandleRename(this,args);
                    }
                    else {
                      bVar3 = std::operator==(&local_60,"REMOVE");
                      if ((bVar3) || (bVar2 = std::operator==(&local_60,"REMOVE_RECURSE"), bVar2)) {
                        bVar2 = true;
                        HandleRemove(this,args,!bVar3);
                      }
                      else {
                        bVar2 = std::operator==(&local_60,"COPY");
                        if (bVar2) {
                          bVar2 = HandleCopyCommand(this,args);
                        }
                        else {
                          bVar2 = std::operator==(&local_60,"INSTALL");
                          if (bVar2) {
                            bVar2 = HandleInstallCommand(this,args);
                          }
                          else {
                            bVar2 = std::operator==(&local_60,"DIFFERENT");
                            if (bVar2) {
                              bVar2 = HandleDifferentCommand(this,args);
                            }
                            else {
                              bVar2 = std::operator==(&local_60,"RPATH_CHANGE");
                              if ((bVar2) || (bVar2 = std::operator==(&local_60,"CHRPATH"), bVar2))
                              {
                                bVar2 = HandleRPathChangeCommand(this,args);
                              }
                              else {
                                bVar2 = std::operator==(&local_60,"RPATH_CHECK");
                                if (bVar2) {
                                  bVar2 = HandleRPathCheckCommand(this,args);
                                }
                                else {
                                  bVar2 = std::operator==(&local_60,"RPATH_REMOVE");
                                  if (bVar2) {
                                    bVar2 = HandleRPathRemoveCommand(this,args);
                                  }
                                  else {
                                    bVar2 = std::operator==(&local_60,"RELATIVE_PATH");
                                    if (bVar2) {
                                      bVar2 = HandleRelativePathCommand(this,args);
                                    }
                                    else {
                                      bVar2 = std::operator==(&local_60,"TO_CMAKE_PATH");
                                      if ((bVar2) ||
                                         (bVar3 = std::operator==(&local_60,"TO_NATIVE_PATH"), bVar3
                                         )) {
                                        bVar2 = HandleCMakePathCommand(this,args,!bVar2);
                                      }
                                      else {
                                        bVar2 = std::operator==(&local_60,"TIMESTAMP");
                                        if (bVar2) {
                                          bVar2 = HandleTimestampCommand(this,args);
                                        }
                                        else {
                                          bVar2 = std::operator==(&local_60,"GENERATE");
                                          if (bVar2) {
                                            bVar2 = HandleGenerateCommand(this,args);
                                          }
                                          else {
                                            bVar2 = std::operator==(&local_60,"LOCK");
                                            if (bVar2) {
                                              bVar2 = HandleLockCommand(this,args);
                                            }
                                            else {
                                              std::operator+(&local_40,
                                                             "does not recognize sub-command ",
                                                             &local_60);
                                              cmCommand::SetError(&this->super_cmCommand,&local_40);
                                              std::__cxx11::string::~string((string *)&local_40);
                                              bVar2 = false;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_60);
  }
  return bVar2;
}

Assistant:

bool cmFileCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("must be called with at least two arguments.");
    return false;
    }
  std::string subCommand = args[0];
  if ( subCommand == "WRITE" )
    {
    return this->HandleWriteCommand(args, false);
    }
  else if ( subCommand == "APPEND" )
    {
    return this->HandleWriteCommand(args, true);
    }
  else if ( subCommand == "DOWNLOAD" )
    {
    return this->HandleDownloadCommand(args);
    }
  else if ( subCommand == "UPLOAD" )
    {
    return this->HandleUploadCommand(args);
    }
  else if ( subCommand == "READ" )
    {
    return this->HandleReadCommand(args);
    }
  else if ( subCommand == "MD5" ||
            subCommand == "SHA1" ||
            subCommand == "SHA224" ||
            subCommand == "SHA256" ||
            subCommand == "SHA384" ||
            subCommand == "SHA512" )
    {
    return this->HandleHashCommand(args);
    }
  else if ( subCommand == "STRINGS" )
    {
    return this->HandleStringsCommand(args);
    }
  else if ( subCommand == "GLOB" )
    {
    return this->HandleGlobCommand(args, false);
    }
  else if ( subCommand == "GLOB_RECURSE" )
    {
    return this->HandleGlobCommand(args, true);
    }
  else if ( subCommand == "MAKE_DIRECTORY" )
    {
    return this->HandleMakeDirectoryCommand(args);
    }
  else if ( subCommand == "RENAME" )
    {
    return this->HandleRename(args);
    }
  else if ( subCommand == "REMOVE" )
    {
    return this->HandleRemove(args, false);
    }
  else if ( subCommand == "REMOVE_RECURSE" )
    {
    return this->HandleRemove(args, true);
    }
  else if ( subCommand == "COPY" )
    {
    return this->HandleCopyCommand(args);
    }
  else if ( subCommand == "INSTALL" )
    {
    return this->HandleInstallCommand(args);
    }
  else if ( subCommand == "DIFFERENT" )
    {
    return this->HandleDifferentCommand(args);
    }
  else if ( subCommand == "RPATH_CHANGE" || subCommand == "CHRPATH" )
    {
    return this->HandleRPathChangeCommand(args);
    }
  else if ( subCommand == "RPATH_CHECK" )
    {
    return this->HandleRPathCheckCommand(args);
    }
  else if ( subCommand == "RPATH_REMOVE" )
    {
    return this->HandleRPathRemoveCommand(args);
    }
  else if ( subCommand == "RELATIVE_PATH" )
    {
    return this->HandleRelativePathCommand(args);
    }
  else if ( subCommand == "TO_CMAKE_PATH" )
    {
    return this->HandleCMakePathCommand(args, false);
    }
  else if ( subCommand == "TO_NATIVE_PATH" )
    {
    return this->HandleCMakePathCommand(args, true);
    }
  else if ( subCommand == "TIMESTAMP" )
    {
    return this->HandleTimestampCommand(args);
    }
  else if ( subCommand == "GENERATE" )
    {
    return this->HandleGenerateCommand(args);
    }
  else if ( subCommand == "LOCK" )
    {
    return this->HandleLockCommand(args);
    }

  std::string e = "does not recognize sub-command "+subCommand;
  this->SetError(e);
  return false;
}